

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clEnqueueAcquireExternalMemObjectsKHR
                 (cl_command_queue command_queue,cl_uint num_mem_objects,cl_mem *mem_objects,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  bool bVar2;
  byte bVar3;
  cl_int cVar4;
  CLdispatchX *pCVar5;
  time_point tVar6;
  time_point tVar7;
  cl_command_queue p_Var8;
  uint64_t uVar9;
  allocator local_89;
  uint64_t local_88;
  cl_command_queue local_80;
  time_point local_78;
  string local_70;
  time_point local_50;
  cl_event local_event;
  time_point local_40;
  undefined8 local_38;
  
  this = g_pIntercept;
  local_78.__d.__r._0_4_ = 0xffffffdc;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     (local_80 = command_queue, local_50.__d.__r = (duration)(duration)mem_objects,
     pCVar5 = CLIntercept::dispatchX(g_pIntercept,command_queue),
     pCVar5->clEnqueueAcquireExternalMemObjectsKHR ==
     (_func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr *)0x0))
  goto LAB_0012ed07;
  local_88 = CLIntercept::incrementEnqueueCounter(this);
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureMinEnqueue <= local_88 &&
       (local_88 <= (this->m_Config).AubCaptureMaxEnqueue)) &&
      ((this->m_Config).AubCaptureIndividualEnqueues == false)))) {
    CLIntercept::startAubCapture
              (this,"clEnqueueAcquireExternalMemObjectsKHR",local_88,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,local_80);
  }
  local_78.__d.__r = (duration)((ulong)local_78.__d.__r & 0xffffffff00000000);
  if ((this->m_Config).NullEnqueue == false) {
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingEnter
                (this,"clEnqueueAcquireExternalMemObjectsKHR",local_88,(cl_kernel)0x0);
    }
    if ((this->m_Config).EventChecking == true) {
      CLIntercept::checkEventList
                (this,"clEnqueueAcquireExternalMemObjectsKHR",num_events_in_wait_list,
                 event_wait_list,event);
    }
    local_event = (cl_event)0x0;
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       (((this->m_Config).ChromePerformanceTiming == false &&
        ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
      local_40.__d.__r = (duration)0;
      local_38 = 0;
    }
    else {
      local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_38 = CONCAT71((int7)((ulong)local_40.__d.__r >> 8),event == (cl_event *)0x0);
      if (event == (cl_event *)0x0) {
        event = &local_event;
      }
    }
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_78.__d.__r = (duration)0;
    }
    else {
      local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    cVar4 = (*pCVar5->clEnqueueAcquireExternalMemObjectsKHR)
                      (local_80,num_mem_objects,(cl_mem *)local_50.__d.__r,num_events_in_wait_list,
                       event_wait_list,event);
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_50.__d.__r = (duration)0;
      uVar9 = local_88;
      p_Var8 = local_80;
    }
    else {
      local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      p_Var8 = local_80;
      uVar9 = local_88;
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_88 &&
          (local_88 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&local_70,"",&local_89);
        CLIntercept::updateHostTimingStats
                  (this,"clEnqueueAcquireExternalMemObjectsKHR",&local_70,local_78,local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       ((this->m_Config).ChromePerformanceTiming == false)) {
      if ((event != (cl_event *)0x0) &&
         ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0012ee0a:
        if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= uVar9) &&
           (uVar9 <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
          if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
            std::__cxx11::string::string
                      ((string *)&local_70,"clEnqueueAcquireExternalMemObjectsKHR",&local_89);
            bVar2 = std::operator!=(&local_70,"clEnqueueUnmapMemObject");
            std::__cxx11::string::~string((string *)&local_70);
            if (!bVar2) goto LAB_0012eeb2;
          }
          std::__cxx11::string::string((string *)&local_70,"",&local_89);
          CLIntercept::addTimingEvent
                    (this,"clEnqueueAcquireExternalMemObjectsKHR",uVar9,local_40,&local_70,p_Var8,
                     *event);
          std::__cxx11::string::~string((string *)&local_70);
        }
LAB_0012eeb2:
        if ((char)local_38 != '\0') {
          (*(this->m_Dispatch).clReleaseEvent)(*event);
          goto LAB_0012eec4;
        }
      }
    }
    else {
      if (event != (cl_event *)0x0) goto LAB_0012ee0a;
LAB_0012eec4:
      event = (cl_event *)0x0;
    }
    if ((this->m_Config).ErrorLogging == false) {
      bVar3 = (this->m_Config).ErrorAssert;
      if ((bool)bVar3 == false) {
        if ((cVar4 == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0012ef29;
      }
      else if (cVar4 == 0) goto LAB_0012eefe;
LAB_0012ef10:
      if ((bVar3 & 1) != 0) {
        raise(5);
      }
      if ((this->m_Config).NoErrors != false) {
        cVar4 = 0;
      }
    }
    else {
      if (cVar4 != 0) {
        CLIntercept::logError(this,"clEnqueueAcquireExternalMemObjectsKHR",cVar4);
        bVar3 = (this->m_Config).ErrorAssert;
        goto LAB_0012ef10;
      }
LAB_0012eefe:
      cVar4 = 0;
    }
LAB_0012ef29:
    if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
       (*event != (cl_event)0x0)) {
      LOCK();
      pCVar1 = &(this->m_ObjectTracker).m_Events;
      (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
           (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clEnqueueAcquireExternalMemObjectsKHR",cVar4,event,(cl_sync_point_khr *)0x0);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      std::__cxx11::string::string((string *)&local_70,"",&local_89);
      CLIntercept::chromeCallLoggingExit
                (this,"clEnqueueAcquireExternalMemObjectsKHR",&local_70,true,uVar9,local_78,local_50
                );
      std::__cxx11::string::~string((string *)&local_70);
    }
    local_78.__d.__r._0_4_ = cVar4;
    if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
       (((this->m_Config).ChromeCallLogging != false ||
        ((this->m_Config).ChromePerformanceTiming == true)))) {
      CLIntercept::addEvent(this,*event,uVar9);
    }
  }
  p_Var8 = local_80;
  uVar9 = local_88;
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR");
    cVar4 = (*(this->m_Dispatch).clFinish)(local_80);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR",cVar4);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar9 &&
          (uVar9 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_event);
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&local_70,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_event);
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&local_70,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    p_Var8 = local_80;
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar9 &&
          (uVar9 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_event);
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&local_70,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_event);
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&local_70,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_80);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (uVar9 < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < uVar9)))) {
    CLIntercept::stopAubCapture(this,p_Var8);
  }
LAB_0012ed07:
  return (cl_int)local_78.__d.__r;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueAcquireExternalMemObjectsKHR(
    cl_command_queue command_queue,
    cl_uint num_mem_objects,
    const cl_mem *mem_objects,
    cl_uint num_events_in_wait_list,
    const cl_event *event_wait_list,
    cl_event *event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_queue);
        if( dispatchX.clEnqueueAcquireExternalMemObjectsKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                CALL_LOGGING_ENTER();
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueAcquireExternalMemObjectsKHR(
                    command_queue,
                    num_mem_objects,
                    mem_objects,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}